

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

bool __thiscall
HighsCutGeneration::tryGenerateCut
          (HighsCutGeneration *this,vector<int,_std::allocator<int>_> *inds_,
          vector<double,_std::allocator<double>_> *vals_,bool hasUnboundedInts,bool hasGeneralInts,
          bool hasContinuous,double minEfficacy,bool onlyInitialCMIRScale,bool allowRejectCut,
          bool lpSol)

{
  undefined1 uVar1;
  bool bVar2;
  double dVar3;
  pointer pdVar4;
  double *pdVar5;
  byte in_CL;
  undefined8 in_RDX;
  HighsCutGeneration *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  byte in_R8B;
  byte in_R9B;
  double in_XMM0_Qa;
  double dVar6;
  byte in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  double efficacy;
  HighsInt i;
  double sqrnorm;
  double violation;
  double minMirEfficacy;
  bool saveIntegralCoefficients;
  bool saveIntegalSupport;
  bool success;
  HighsCDouble tmpRhs;
  vector<double,_std::allocator<double>_> tmpSolval;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpComplementation;
  vector<int,_std::allocator<int>_> tmpInds;
  HighsCutGeneration *in_stack_000000f0;
  vector<double,_std::allocator<double>_> tmpVals;
  undefined1 in_stack_0000030f;
  double in_stack_00000310;
  HighsCutGeneration *in_stack_00000318;
  HighsCutGeneration *in_stack_000004f8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  undefined5 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec5;
  undefined1 in_stack_fffffffffffffec6;
  allocator_type *in_stack_fffffffffffffed8;
  allocator_type *__a;
  HighsCutGeneration *this_00;
  HighsLpRelaxation **__first;
  vector<double,_std::allocator<double>_> *this_01;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_ec;
  byte local_cb;
  byte local_ca;
  bool local_c9;
  HighsCDouble local_c8 [4];
  allocator_type local_81 [48];
  vector<double,_std::allocator<double>_> local_51;
  byte local_33;
  byte local_32;
  byte local_31;
  double local_30;
  byte local_23;
  byte local_22;
  byte local_21;
  bool local_1;
  
  uVar1 = (undefined1)((ulong)in_RDX >> 0x38);
  local_21 = in_CL & 1;
  local_22 = in_R8B & 1;
  local_23 = in_R9B & 1;
  local_31 = in_stack_00000008 & 1;
  local_32 = in_stack_00000010 & 1;
  local_33 = in_stack_00000018 & 1;
  if (local_21 == 0) {
    this_00 = (HighsCutGeneration *)
              in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    __first = &this_00->lpRelaxation +
              *(int *)((long)&in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4);
    this_01 = &local_51;
    local_30 = in_XMM0_Qa;
    std::allocator<double>::allocator((allocator<double> *)0x5927ca);
    std::vector<double,std::allocator<double>>::vector<double*,void>
              (this_01,(double *)__first,(double *)this_00,in_stack_fffffffffffffed8);
    std::allocator<double>::~allocator((allocator<double> *)0x5927f5);
    pdVar5 = in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    dVar6 = (double)((long)pdVar5 +
                    (long)*(int *)((long)&in_RDI[9].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish + 4) * 4);
    __a = local_81;
    std::allocator<int>::allocator((allocator<int> *)0x592828);
    std::vector<int,std::allocator<int>>::vector<int*,void>
              ((vector<int,_std::allocator<int>_> *)this_01,(int *)__first,(int *)this_00,__a);
    std::allocator<int>::~allocator((allocator<int> *)0x592853);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI);
    local_c8[0].hi =
         (double)in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_c8[0].lo =
         (double)in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_c9 = false;
    local_ca = 0;
    local_cb = 0;
    uVar1 = determineCover(in_RSI,(bool)uVar1);
    if ((bool)uVar1) {
      if (((local_23 & 1) == 0) && ((local_22 & 1) == 0)) {
        separateLiftedKnapsackCover(in_stack_000000f0);
        local_c9 = true;
      }
      else if ((local_22 & 1) == 0) {
        in_stack_fffffffffffffec5 = separateLiftedMixedBinaryCover(in_RSI);
        local_c9 = (bool)in_stack_fffffffffffffec5;
      }
      else {
        in_stack_fffffffffffffec6 = separateLiftedMixedIntegerCover(in_stack_000004f8);
        local_c9 = (bool)in_stack_fffffffffffffec6;
      }
    }
    if (local_c9 != false) {
      local_ca = *(byte *)&in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish & 1;
      local_cb = *(byte *)((long)&in_RDI[9].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 1) & 1;
      in_stack_fffffffffffffeb8 =
           (vector<double,_std::allocator<double>_> *)
           HighsCDouble::operator_cast_to_double
                     ((HighsCDouble *)
                      &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      dVar3 = -(double)in_stack_fffffffffffffeb8;
      for (local_ec = 0;
          local_ec <
          *(int *)((long)&in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4); local_ec = local_ec + 1) {
        updateViolationAndNorm
                  (this_00,(HighsInt)((ulong)__a >> 0x20),dVar6,pdVar5,
                   (double *)
                   CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                           CONCAT15(in_stack_fffffffffffffec5,
                                                    in_stack_fffffffffffffec0))));
      }
      dVar6 = sqrt(0.0);
      if (((local_32 & 1) == 0) || (local_30 < dVar3 / dVar6)) {
        std::swap<HighsCDouble>
                  (local_c8,(HighsCDouble *)
                            &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
      }
      else {
        local_c9 = false;
        in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_c8[0].hi;
        in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_c8[0].lo;
      }
    }
    pdVar4 = (pointer)std::vector<int,_std::allocator<int>_>::data
                                ((vector<int,_std::allocator<int>_> *)0x592b8e);
    in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar4;
    pdVar5 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x592baa);
    in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar5;
    bVar2 = cmirCutGenerationHeuristic(in_stack_00000318,in_stack_00000310,(bool)in_stack_0000030f);
    if (bVar2) {
      std::vector<int,_std::allocator<int>_>::swap
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                         CONCAT15(in_stack_fffffffffffffec5,
                                                  in_stack_fffffffffffffec0))),
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8);
      std::vector<double,_std::allocator<double>_>::swap
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                         CONCAT15(in_stack_fffffffffffffec5,
                                                  in_stack_fffffffffffffec0))),
                 in_stack_fffffffffffffeb8);
      pdVar4 = (pointer)std::vector<int,_std::allocator<int>_>::data
                                  ((vector<int,_std::allocator<int>_> *)0x592c16);
      in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = pdVar4;
      pdVar5 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x592c32);
      in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar5;
      local_1 = true;
    }
    else if (local_c9 == false) {
      local_1 = false;
    }
    else {
      in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)local_c8[0].hi;
      in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_c8[0].lo;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                         CONCAT15(in_stack_fffffffffffffec5,
                                                  in_stack_fffffffffffffec0))),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb8)
      ;
      std::vector<double,_std::allocator<double>_>::swap
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                         CONCAT15(in_stack_fffffffffffffec5,
                                                  in_stack_fffffffffffffec0))),
                 in_stack_fffffffffffffeb8);
      pdVar4 = (pointer)std::vector<int,_std::allocator<int>_>::data
                                  ((vector<int,_std::allocator<int>_> *)0x592cbe);
      in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = pdVar4;
      pdVar5 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x592cda);
      in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar5;
      *(byte *)&in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = local_ca;
      *(byte *)((long)&in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1) = local_cb;
      local_1 = true;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                       CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0)
                                      )));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                       CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0)
                                      )));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                       CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0)
                                      )));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffec6,
                                       CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0)
                                      )));
  }
  else {
    local_1 = cmirCutGenerationHeuristic
                        (in_stack_00000318,in_stack_00000310,(bool)in_stack_0000030f);
  }
  return local_1;
}

Assistant:

bool HighsCutGeneration::tryGenerateCut(std::vector<HighsInt>& inds_,
                                        std::vector<double>& vals_,
                                        bool hasUnboundedInts,
                                        bool hasGeneralInts, bool hasContinuous,
                                        double minEfficacy,
                                        bool onlyInitialCMIRScale,
                                        bool allowRejectCut, bool lpSol) {
  // use cmir if there are unbounded integer variables
  if (hasUnboundedInts)
    return cmirCutGenerationHeuristic(minEfficacy, onlyInitialCMIRScale);

  // 0. Save data before determining cover and applying lifting functions
  std::vector<double> tmpVals(vals, vals + rowlen);
  std::vector<HighsInt> tmpInds(inds, inds + rowlen);
  std::vector<uint8_t> tmpComplementation(complementation);
  std::vector<double> tmpSolval(solval);
  HighsCDouble tmpRhs = rhs;

  // 1. Determine a cover, cover does not need to be minimal as neither of
  //    the lifting functions have minimality of the cover as necessary facet
  //    condition
  bool success = false;
  bool saveIntegalSupport = false;
  bool saveIntegralCoefficients = false;
  do {
    if (!determineCover(lpSol)) break;

    // 2. use superadditive lifting function depending on structure of base
    //    inequality:
    //    We have 3 lifting functions available for pure binary knapsack sets,
    //    for mixed-binary knapsack sets and for mixed integer knapsack sets.
    if (!hasContinuous && !hasGeneralInts) {
      separateLiftedKnapsackCover();
      success = true;
    } else if (hasGeneralInts) {
      success = separateLiftedMixedIntegerCover();
    } else {
      assert(hasContinuous);
      assert(!hasGeneralInts);
      success = separateLiftedMixedBinaryCover();
    }
  } while (false);

  double minMirEfficacy = minEfficacy;
  if (success) {
    // save data that might otherwise be overwritten when calling the cmir
    // separator
    saveIntegalSupport = integralSupport;
    saveIntegralCoefficients = integralCoefficients;

    // compute violation and squared norm
    double violation = -double(rhs);
    double sqrnorm = 0.0;
    for (HighsInt i = 0; i < rowlen; ++i) {
      updateViolationAndNorm(i, vals[i], violation, sqrnorm);
    }

    // compute efficacy (distance cut off)
    double efficacy = violation / std::sqrt(sqrnorm);
    if (allowRejectCut && efficacy <= minEfficacy) {
      // reject cut
      success = false;
      rhs = tmpRhs;
    } else {
      // accept cut and increase minimum efficiency requirement for cmir cut
      minMirEfficacy += efficacy;
      std::swap(tmpRhs, rhs);
    }
  }

  // restore indices and values; lifting methods do not modify complementation
  // and, thus, complementation-related data does not have to be restored here.
  inds = tmpInds.data();
  vals = tmpVals.data();

  if (cmirCutGenerationHeuristic(minMirEfficacy, onlyInitialCMIRScale)) {
    // take the cmir cut as it is better
    inds_.swap(tmpInds);
    vals_.swap(tmpVals);
    inds = inds_.data();
    vals = vals_.data();
    return true;
  } else if (success) {
    // take the previous lifted cut as cmir could not improve
    // we restore the old complementation vector, right hand side, and values
    rhs = tmpRhs;
    // note that the solution vector solval also needs to be restored because it
    // depends on the complementation. it would be OK not to restore solval, if
    // there would be a guarantee that it is not used from here on.
    complementation.swap(tmpComplementation);
    solval.swap(tmpSolval);
    inds = inds_.data();
    vals = vals_.data();
    // restore indicators
    integralSupport = saveIntegalSupport;
    integralCoefficients = saveIntegralCoefficients;
    return true;
  } else
    // neither cmir nor lifted cut successful
    return false;
}